

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O3

QNetworkInterface __thiscall QNativeSocketEngine::multicastInterface(QNativeSocketEngine *this)

{
  long lVar1;
  char cVar2;
  long *in_RSI;
  
  lVar1 = in_RSI[1];
  cVar2 = (**(code **)(*in_RSI + 0x78))();
  if (cVar2 == '\0') {
    multicastInterface();
  }
  else if (*(int *)(lVar1 + 0x9c) == 1) {
    QNativeSocketEnginePrivate::nativeMulticastInterface((QNativeSocketEnginePrivate *)this);
  }
  else {
    multicastInterface();
  }
  return (QSharedDataPointer<QNetworkInterfacePrivate>)
         (QSharedDataPointer<QNetworkInterfacePrivate>)this;
}

Assistant:

QNetworkInterface QNativeSocketEngine::multicastInterface() const
{
    Q_D(const QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::multicastInterface(), QNetworkInterface());
    Q_CHECK_TYPE(QNativeSocketEngine::multicastInterface(), QAbstractSocket::UdpSocket, QNetworkInterface());
    return d->nativeMulticastInterface();
}